

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_texture_store_instruction_dispatch
               (Impl *impl,CallInst *instruction,bool multi_sampled)

{
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Value *pVVar4;
  Value *pVVar5;
  Operation *this;
  Type *type;
  Id sample_id;
  Id store_id;
  Operation *op;
  Id local_68;
  uint i_1;
  Id write_values [4];
  uint i;
  uint num_coords;
  uint num_coords_full;
  Id coord [3];
  mapped_type *meta;
  Builder *pBStack_30;
  Id image_id;
  Builder *builder;
  CallInst *pCStack_20;
  bool multi_sampled_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._7_1_ = multi_sampled;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  pBStack_30 = Converter::Impl::builder(impl);
  pCVar1 = instruction_local;
  pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
  meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
  if (((*(int *)&instruction_local[9].super_Instruction.attachments._M_h._M_rehash_policy.field_0x4
        == 2) &&
      (pVVar4 = (Value *)instruction_local[8].super_Instruction.operands.
                         super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
      pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2), pVVar4 == pVVar5))
     && ((builder._7_1_ & 1) == 0)) {
    *(Id *)((long)&instruction_local[6].super_Instruction.super_Value.tween_id + 4) = meta._4_4_;
    *(undefined4 *)&instruction_local[6].super_Instruction.is_terminator = 0x43;
    return true;
  }
  coord._4_8_ = std::
                unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                              *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                 _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
  memset(&num_coords,0,0xc);
  i = 0;
  write_values[3] = 0;
  bVar2 = get_image_dimensions((Impl *)instruction_local,meta._4_4_,&i,write_values + 3);
  if (bVar2) {
    if (i < 4) {
      for (write_values[2] = 0; pCVar1 = instruction_local, write_values[2] < i;
          write_values[2] = write_values[2] + 1) {
        pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,write_values[2] + 2)
        ;
        IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
        (&num_coords)[write_values[2]] = IVar3;
      }
      memset(&local_68,0,0x10);
      for (op._4_4_ = 0; pCVar1 = instruction_local, op._4_4_ < 4; op._4_4_ = op._4_4_ + 1) {
        pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,op._4_4_ + 5);
        Converter::Impl::register_externally_visible_write((Impl *)pCVar1,pVVar4);
        pCVar1 = instruction_local;
        pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,op._4_4_ + 5);
        IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
        (&local_68)[op._4_4_] = IVar3;
      }
      this = Converter::Impl::allocate((Impl *)instruction_local,OpImageWrite);
      Operation::add_id(this,meta._4_4_);
      pCVar1 = instruction_local;
      IVar3 = spv::Builder::makeUintType(pBStack_30,0x20);
      IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&num_coords,i);
      Operation::add_id(this,IVar3);
      pCVar1 = instruction_local;
      pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,5);
      type = LLVMBC::Value::getType(pVVar4);
      IVar3 = Converter::Impl::get_type_id((Impl *)pCVar1,type,0);
      IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&local_68,4);
      IVar3 = Converter::Impl::fixup_store_type_typed
                        ((Impl *)instruction_local,*(ComponentType *)(coord._4_8_ + 1),4,IVar3);
      Operation::add_id(this,IVar3);
      spv::Builder::addCapability(pBStack_30,CapabilityStorageImageWriteWithoutFormat);
      pCVar1 = instruction_local;
      if ((builder._7_1_ & 1) != 0) {
        pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,10);
        IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
        Operation::add_literal(this,0x40);
        Operation::add_id(this,IVar3);
        spv::Builder::addCapability(pBStack_30,CapabilityStorageImageMultisample);
      }
      Converter::Impl::add((Impl *)instruction_local,this,(bool)(*(byte *)(coord._4_8_ + 0x2b) & 1))
      ;
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_texture_store_instruction_dispatch(Converter::Impl &impl, const llvm::CallInst *instruction, bool multi_sampled)
{
	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	// Deferred 64-bit atomic. Resolve in a later AGS atomic.
	if (impl.ags.num_instructions == 2 &&
	    impl.ags.backdoor_instructions[0] == instruction->getOperand(2) && !multi_sampled)
	{
		impl.ags.active_uav_ptr = image_id;
		impl.ags.active_uav_op = DXIL::Op::TextureStore;
		return true;
	}

	const auto &meta = impl.handle_to_resource_meta[image_id];
	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 2));

	spv::Id write_values[4] = {};
	for (unsigned i = 0; i < 4; i++)
	{
		impl.register_externally_visible_write(instruction->getOperand(i + 5));
		write_values[i] = impl.get_id_for_value(instruction->getOperand(i + 5));
	}

	// Ignore write mask. We cannot do anything meaningful about it.
	// The write mask must cover all components in the image, and there is no "sliced write" support for typed resources.

	Operation *op = impl.allocate(spv::OpImageWrite);

	op->add_id(image_id);
	op->add_id(impl.build_vector(builder.makeUintType(32), coord, num_coords_full));

	spv::Id store_id = impl.build_vector(impl.get_type_id(instruction->getOperand(5)->getType()), write_values, 4);
	store_id = impl.fixup_store_type_typed(meta.component_type, 4, store_id);
	op->add_id(store_id);
	builder.addCapability(spv::CapabilityStorageImageWriteWithoutFormat);

	if (multi_sampled)
	{
		spv::Id sample_id = impl.get_id_for_value(instruction->getOperand(10));
		op->add_literal(spv::ImageOperandsSampleMask);
		op->add_id(sample_id);
		builder.addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);
	return true;
}